

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O2

int lws_ssl_capable_read(lws *wsi,uchar *buf,size_t len)

{
  char cVar1;
  lws_context *plVar2;
  SSL *s;
  uint n;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  char *pcVar6;
  lws_dll2 *d;
  uint num;
  
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    iVar3 = lws_ssl_capable_read_no_ssl(wsi,buf,len);
    return iVar3;
  }
  plVar2 = (wsi->a).context;
  cVar1 = wsi->tsi;
  puVar5 = (uint *)__errno_location();
  *puVar5 = 0;
  ERR_clear_error();
  num = (uint)len;
  n = SSL_read((SSL *)(wsi->tls).ssl,buf,num);
  pcVar6 = lws_wsi_tag(wsi);
  _lws_log(0x10,"%s: SSL_read says %d\n",pcVar6,(ulong)n);
  if ((int)n < 1) {
    uVar4 = lws_ssl_get_error(wsi,n);
    pcVar6 = lws_wsi_tag(wsi);
    _lws_log(0x10,"%s: ssl err %d errno %d\n",pcVar6,(ulong)uVar4,(ulong)*puVar5);
    if (uVar4 == 6) {
      return -1;
    }
    if (((uVar4 & 0xfffffffb) == 1) || (*puVar5 == 0x6b)) {
      wsi->field_0x46f = wsi->field_0x46f | 0x10;
      return -1;
    }
    iVar3 = SSL_want((SSL *)(wsi->tls).ssl);
    if (iVar3 == 3) {
      pcVar6 = "%s: WANT_READ\n";
    }
    else {
      iVar3 = SSL_want((SSL *)(wsi->tls).ssl);
      if (iVar3 != 2) goto LAB_00131c02;
      pcVar6 = "%s: WANT_WRITE\n";
    }
    _lws_log(0x10,pcVar6,"lws_ssl_capable_read");
    pcVar6 = lws_wsi_tag(wsi);
    _lws_log(0x10,"%s: LWS_SSL_CAPABLE_MORE_SERVICE\n",pcVar6);
    num = 0xfffffffc;
  }
  else {
LAB_00131c02:
    if ((n == num) && (s = (SSL *)(wsi->tls).ssl, s != (SSL *)0x0)) {
      iVar3 = SSL_pending(s);
      if (iVar3 == 0) {
        __lws_ssl_remove_wsi_from_buffered_list(wsi);
      }
      else {
        d = &(wsi->tls).dll_pending_tls;
        iVar3 = lws_dll2_is_detached(d);
        if (iVar3 != 0) {
          lws_dll2_add_head(d,&plVar2->pt[cVar1].tls.dll_pending_tls_owner);
        }
      }
    }
    else {
      lws_ssl_remove_wsi_from_buffered_list(wsi);
      num = n;
    }
  }
  return num;
}

Assistant:

int
lws_ssl_capable_read(struct lws *wsi, unsigned char *buf, size_t len)
{
	struct lws_context *context = wsi->a.context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n = 0, m;

	if (!wsi->tls.ssl)
		return lws_ssl_capable_read_no_ssl(wsi, buf, len);

	errno = 0;
	ERR_clear_error();
	n = SSL_read(wsi->tls.ssl, buf, (int)(ssize_t)len);
#if defined(LWS_PLAT_FREERTOS)
	if (!n && errno == LWS_ENOTCONN) {
		lwsl_debug("%s: SSL_read ENOTCONN\n", lws_wsi_tag(wsi));
		return LWS_SSL_CAPABLE_ERROR;
	}
#endif

	lwsl_debug("%s: SSL_read says %d\n", lws_wsi_tag(wsi), n);
	/* manpage: returning 0 means connection shut down
	 *
	 * 2018-09-10: https://github.com/openssl/openssl/issues/1903
	 *
	 * So, in summary, if you get a 0 or -1 return from SSL_read() /
	 * SSL_write(), you should call SSL_get_error():
	 *
	 *  - If you get back SSL_ERROR_RETURN_ZERO then you know the connection
	 *    has been cleanly shutdown by the peer. To fully close the
	 *    connection you may choose to call SSL_shutdown() to send a
	 *    close_notify back.
	 *
	 *  - If you get back SSL_ERROR_SSL then some kind of internal or
	 *    protocol error has occurred. More details will be on the SSL error
	 *    queue. You can also call SSL_get_shutdown(). If this indicates a
	 *    state of SSL_RECEIVED_SHUTDOWN then you know a fatal alert has
	 *    been received from the peer (if it had been a close_notify then
	 *    SSL_get_error() would have returned SSL_ERROR_RETURN_ZERO).
	 *    SSL_ERROR_SSL is considered fatal - you should not call
	 *    SSL_shutdown() in this case.
	 *
	 *  - If you get back SSL_ERROR_SYSCALL then some kind of fatal (i.e.
	 *    non-retryable) error has occurred in a system call.
	 */
	if (n <= 0) {
		m = lws_ssl_get_error(wsi, n);
		lwsl_debug("%s: ssl err %d errno %d\n", lws_wsi_tag(wsi), m, errno);
		if (m == SSL_ERROR_ZERO_RETURN) /* cleanly shut down */
			goto do_err;

		/* hm not retryable.. could be 0 size pkt or error  */

		if (m == SSL_ERROR_SSL || m == SSL_ERROR_SYSCALL ||
		    errno == LWS_ENOTCONN) {

			/* unclean, eg closed conn */

			wsi->socket_is_permanently_unusable = 1;
do_err:
#if defined(LWS_WITH_SYS_METRICS)
		if (wsi->a.vhost)
			lws_metric_event(wsi->a.vhost->mt_traffic_rx,
					 METRES_NOGO, 0);
#endif
			return LWS_SSL_CAPABLE_ERROR;
		}

		/* retryable? */

		if (SSL_want_read(wsi->tls.ssl)) {
			lwsl_debug("%s: WANT_READ\n", __func__);
			lwsl_debug("%s: LWS_SSL_CAPABLE_MORE_SERVICE\n", lws_wsi_tag(wsi));
			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}
		if (SSL_want_write(wsi->tls.ssl)) {
			lwsl_debug("%s: WANT_WRITE\n", __func__);
			lwsl_debug("%s: LWS_SSL_CAPABLE_MORE_SERVICE\n", lws_wsi_tag(wsi));
			return LWS_SSL_CAPABLE_MORE_SERVICE;
		}

		/* keep on trucking it seems */
	}

#if defined(LWS_TLS_LOG_PLAINTEXT_RX)
	/*
	 * If using openssl type tls library, this is the earliest point for all
	 * paths to dump what was received as decrypted data from the tls tunnel
	 */
	lwsl_notice("%s: len %d\n", __func__, n);
	lwsl_hexdump_notice(buf, (unsigned int)n);
#endif

#if defined(LWS_WITH_SYS_METRICS)
	if (wsi->a.vhost)
		lws_metric_event(wsi->a.vhost->mt_traffic_rx, METRES_GO, (u_mt_t)n);
#endif

	/*
	 * if it was our buffer that limited what we read,
	 * check if SSL has additional data pending inside SSL buffers.
	 *
	 * Because these won't signal at the network layer with POLLIN
	 * and if we don't realize, this data will sit there forever
	 */
	if (n != (int)(ssize_t)len)
		goto bail;
	if (!wsi->tls.ssl)
		goto bail;

	if (SSL_pending(wsi->tls.ssl)) {
		if (lws_dll2_is_detached(&wsi->tls.dll_pending_tls))
			lws_dll2_add_head(&wsi->tls.dll_pending_tls,
					  &pt->tls.dll_pending_tls_owner);
	} else
		__lws_ssl_remove_wsi_from_buffered_list(wsi);

	return n;
bail:
	lws_ssl_remove_wsi_from_buffered_list(wsi);

	return n;
}